

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::tools::ByteBufferTEst_test_read_write_double_Test::TestBody
          (ByteBufferTEst_test_read_write_double_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e0;
  Message local_d8;
  double local_d0;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_1;
  ByteBuffer byte_buffer2;
  double local_88;
  double double2;
  Message local_78;
  double local_70;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  ByteBuffer local_48 [8];
  ByteBuffer byte_buffer1;
  double local_18;
  double double1;
  ByteBufferTEst_test_read_write_double_Test *this_local;
  
  local_18 = 583824.324;
  double1 = (double)this;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(local_48,8);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(local_18);
  local_70 = (double)bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_68,"double1","byte_buffer1.ReadDouble()",&local_18,&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(&local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&double2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&double2,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&double2);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_88 = -478324.423;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer((ByteBuffer *)&gtest_ar_1.message_,4);
  bidfx_public_api::tools::ByteBuffer::WriteDouble(local_88);
  local_d0 = (double)bidfx_public_api::tools::ByteBuffer::ReadDouble();
  testing::internal::EqHelper<false>::Compare<double,double>
            ((EqHelper<false> *)local_c8,"double2","byte_buffer2.ReadDouble()",&local_88,&local_d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar1) {
    testing::Message::Message(&local_d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0xc3,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer((ByteBuffer *)&gtest_ar_1.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(local_48);
  return;
}

Assistant:

TEST(ByteBufferTEst, test_read_write_double)
{
    double double1 = 583824.324;
    ByteBuffer byte_buffer1(8);
    byte_buffer1.WriteDouble(double1);
    EXPECT_EQ(double1, byte_buffer1.ReadDouble());

    double double2 = -478324.423;
    ByteBuffer byte_buffer2(4);
    byte_buffer2.WriteDouble(double2);
    EXPECT_EQ(double2, byte_buffer2.ReadDouble());
}